

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

void __thiscall DListMenu::Init(DListMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  int center;
  int iVar6;
  
  (this->super_DMenu).mParentMenu.field_0.p = parent;
  if (((parent != (DMenu *)0x0) && (((parent->super_DObject).ObjectFlags & 3) != 0)) &&
     (((this->super_DMenu).super_DObject.ObjectFlags & 4) != 0)) {
    GC::Barrier((DObject *)this,&parent->super_DObject);
  }
  this->mDesc = desc;
  if (desc->mCenter == true) {
    iVar6 = 0xa0;
    for (uVar5 = 0;
        uVar4 = (ulong)(desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count,
        uVar5 < uVar4; uVar5 = uVar5 + 1) {
      iVar2 = (*(desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]->
                _vptr_FListMenuItem[0x10])();
      if (0 < iVar2) {
        iVar1 = this->mDesc->mSelectOfsX;
        iVar3 = (*(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]
                  ->_vptr_FListMenuItem[5])();
        if (((char)iVar3 != '\0') && (iVar2 = ((iVar2 - iVar1) / -2 - iVar1) + 0xa0, iVar2 < iVar6))
        {
          iVar6 = iVar2;
        }
      }
      desc = this->mDesc;
    }
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      iVar2 = (*(desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]->
                _vptr_FListMenuItem[0x10])();
      desc = this->mDesc;
      if (0 < iVar2) {
        (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5]->mXpos = iVar6;
      }
      uVar4 = (ulong)(desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count;
    }
  }
  return;
}

Assistant:

void DListMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	mParentMenu = parent;
	GC::WriteBarrier(this, parent);
	mDesc = desc;
	if (desc->mCenter)
	{
		int center = 160;
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int xpos = mDesc->mItems[i]->GetX();
			int width = mDesc->mItems[i]->GetWidth();
			int curx = mDesc->mSelectOfsX;

			if (width > 0 && mDesc->mItems[i]->Selectable())
			{
				int left = 160 - (width - curx) / 2 - curx;
				if (left < center) center = left;
			}
		}
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int width = mDesc->mItems[i]->GetWidth();

			if (width > 0)
			{
				mDesc->mItems[i]->SetX(center);
			}
		}
	}
}